

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O3

void __thiscall
CTxMemPool::UpdateForDescendants
          (CTxMemPool *this,txiter updateIt,cacheMap *cachedDescendants,
          set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *setExclude,
          set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *descendants_to_remove)

{
  size_type *psVar1;
  index_node_type *piVar2;
  index_node_type *piVar3;
  key_type kVar4;
  bool bVar5;
  int modifySize;
  iterator iVar6;
  _Rb_tree_node_base *p_Var7;
  const_iterator cVar8;
  _Rb_tree_node_base *p_Var9;
  const_iterator cVar10;
  int64_t iVar11;
  _Rb_tree<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<___lti_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
  *this_00;
  int64_t iVar12;
  _Base_ptr p_Var13;
  CAmount modifyFee;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_>,_std::_Rb_tree_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  pVar14;
  Children descendants;
  Children stageEntries;
  long local_d0;
  reference_wrapper<const_CTxMemPoolEntry> local_a8;
  key_type local_a0;
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  local_98;
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0.node = updateIt.node;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::operator=(&local_68,
              (_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)((long)&((updateIt.node)->
                         super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                         ).
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                         .
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                         .
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                         .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
                         super_pod_value_holder<CTxMemPoolEntry>.space + 0x40));
  if (local_68._M_impl.super__Rb_tree_header._M_node_count != 0) {
    do {
      piVar2 = *(index_node_type **)(local_68._M_impl.super__Rb_tree_header._M_header._M_left + 1);
      local_a8._M_data = (CTxMemPoolEntry *)piVar2;
      std::
      _Rb_tree<std::reference_wrapper<CTxMemPoolEntry_const>,std::reference_wrapper<CTxMemPoolEntry_const>,std::_Identity<std::reference_wrapper<CTxMemPoolEntry_const>>,CompareIteratorByHash,std::allocator<std::reference_wrapper<CTxMemPoolEntry_const>>>
      ::_M_insert_unique<std::reference_wrapper<CTxMemPoolEntry_const>>
                ((_Rb_tree<std::reference_wrapper<CTxMemPoolEntry_const>,std::reference_wrapper<CTxMemPoolEntry_const>,std::_Identity<std::reference_wrapper<CTxMemPoolEntry_const>>,CompareIteratorByHash,std::allocator<std::reference_wrapper<CTxMemPoolEntry_const>>>
                  *)&local_98,&local_a8);
      local_a8._M_data = (CTxMemPoolEntry *)piVar2;
      pVar14 = std::
               _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               ::equal_range(&local_68,&local_a8);
      std::
      _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
      ::_M_erase_aux(&local_68,(_Base_ptr)pVar14.first._M_node,(_Base_ptr)pVar14.second._M_node);
      for (p_Var9 = *(_Rb_tree_node_base **)
                     ((long)&(piVar2->
                             super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                             ).
                             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                             .
                             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                             .
                             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                             .
                             super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                             .super_pod_value_holder<CTxMemPoolEntry>.space + 0x58);
          p_Var9 != (_Rb_tree_node_base *)
                    ((long)&(piVar2->
                            super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                            ).
                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                            .
                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                            .
                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                            .
                            super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                            .super_pod_value_holder<CTxMemPoolEntry>.space + 0x48U);
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        piVar3 = *(index_node_type **)(p_Var9 + 1);
        local_a8._M_data = (CTxMemPoolEntry *)piVar3;
        iVar6 = std::_Rb_tree<$3afb3733$>::find(&cachedDescendants->_M_t,(key_type *)&local_a8);
        if ((_Rb_tree_header *)iVar6._M_node ==
            &(cachedDescendants->_M_t)._M_impl.super__Rb_tree_header) {
          local_a8._M_data = (CTxMemPoolEntry *)piVar3;
          cVar8 = std::
                  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                  ::find(&local_98,&local_a8);
          if ((_Rb_tree_header *)cVar8._M_node == &local_98._M_impl.super__Rb_tree_header) {
            local_a8._M_data = (CTxMemPoolEntry *)piVar3;
            std::
            _Rb_tree<std::reference_wrapper<CTxMemPoolEntry_const>,std::reference_wrapper<CTxMemPoolEntry_const>,std::_Identity<std::reference_wrapper<CTxMemPoolEntry_const>>,CompareIteratorByHash,std::allocator<std::reference_wrapper<CTxMemPoolEntry_const>>>
            ::_M_insert_unique<std::reference_wrapper<CTxMemPoolEntry_const>>
                      ((_Rb_tree<std::reference_wrapper<CTxMemPoolEntry_const>,std::reference_wrapper<CTxMemPoolEntry_const>,std::_Identity<std::reference_wrapper<CTxMemPoolEntry_const>>,CompareIteratorByHash,std::allocator<std::reference_wrapper<CTxMemPoolEntry_const>>>
                        *)&local_68,&local_a8);
          }
        }
        else {
          for (p_Var7 = *(_Rb_tree_node_base **)(iVar6._M_node + 2);
              p_Var7 != (_Rb_tree_node_base *)&iVar6._M_node[1]._M_left;
              p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
            local_a8._M_data = *(CTxMemPoolEntry **)(p_Var7 + 1);
            std::
            _Rb_tree<std::reference_wrapper<CTxMemPoolEntry_const>,std::reference_wrapper<CTxMemPoolEntry_const>,std::_Identity<std::reference_wrapper<CTxMemPoolEntry_const>>,CompareIteratorByHash,std::allocator<std::reference_wrapper<CTxMemPoolEntry_const>>>
            ::_M_insert_unique<std::reference_wrapper<CTxMemPoolEntry_const>>
                      ((_Rb_tree<std::reference_wrapper<CTxMemPoolEntry_const>,std::reference_wrapper<CTxMemPoolEntry_const>,std::_Identity<std::reference_wrapper<CTxMemPoolEntry_const>>,CompareIteratorByHash,std::allocator<std::reference_wrapper<CTxMemPoolEntry_const>>>
                        *)&local_98,&local_a8);
          }
        }
      }
    } while (local_68._M_impl.super__Rb_tree_header._M_node_count != 0);
  }
  if ((_Rb_tree_header *)local_98._M_impl.super__Rb_tree_header._M_header._M_left ==
      &local_98._M_impl.super__Rb_tree_header) {
    local_d0 = 0;
    modifyFee = 0;
    modifySize = 0;
  }
  else {
    modifySize = 0;
    modifyFee = 0;
    local_d0 = 0;
    p_Var13 = local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      piVar2 = *(index_node_type **)(p_Var13 + 1);
      cVar10 = std::
               _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
               ::find(&setExclude->_M_t,
                      (key_type *)
                      (*(long *)&(piVar2->
                                 super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                 ).
                                 super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                 .
                                 super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                 .
                                 super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                 .
                                 super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                 .super_pod_value_holder<CTxMemPoolEntry>.space + 0x39));
      if ((_Rb_tree_header *)cVar10._M_node == &(setExclude->_M_t)._M_impl.super__Rb_tree_header) {
        iVar11 = GetVirtualTransactionSize
                           ((long)*(int *)((long)&(piVar2->
                                                  super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                                  ).
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                                  .
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                                  .
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                                  .
                                                  super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                                  .super_pod_value_holder<CTxMemPoolEntry>.space +
                                          0x78),
                            *(int64_t *)
                             ((long)&(piVar2->
                                     super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                     ).
                                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                     .
                                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                     .
                                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                     .
                                     super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                     .super_pod_value_holder<CTxMemPoolEntry>.space + 0xa0),
                            nBytesPerSigOp);
        modifyFee = modifyFee +
                    *(long *)((long)&(piVar2->
                                     super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                     ).
                                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                     .
                                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                     .
                                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                     .
                                     super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                     .super_pod_value_holder<CTxMemPoolEntry>.space + 0xa8);
        this_00 = (_Rb_tree<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<___lti_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
                   *)std::map<$25c3d160$>::operator[](cachedDescendants,&local_a0);
        local_a8._M_data = (CTxMemPoolEntry *)piVar2;
        std::
        _Rb_tree<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<...lti_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
        ::
        _M_insert_unique<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>
                  (this_00,(hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                            *)&local_a8);
        kVar4.node = local_a0.node;
        iVar12 = GetVirtualTransactionSize
                           ((long)*(int *)((long)&((local_a0.node)->
                                                  super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                                  ).
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                                  .
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                                  .
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                                  .
                                                  super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                                  .super_pod_value_holder<CTxMemPoolEntry>.space +
                                          0x78),
                            *(int64_t *)
                             ((long)&((local_a0.node)->
                                     super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                     ).
                                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                     .
                                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                     .
                                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                     .
                                     super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                     .super_pod_value_holder<CTxMemPoolEntry>.space + 0xa0),
                            nBytesPerSigOp);
        CTxMemPoolEntry::UpdateAncestorState
                  ((CTxMemPoolEntry *)piVar2,(int32_t)iVar12,
                   *(CAmount *)
                    ((long)&((kVar4.node)->
                            super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                            ).
                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                            .
                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                            .
                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                            .
                            super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                            .super_pod_value_holder<CTxMemPoolEntry>.space + 0xa8),1,
                   *(int64_t *)
                    ((long)&((kVar4.node)->
                            super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                            ).
                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                            .
                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                            .
                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                            .
                            super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                            .super_pod_value_holder<CTxMemPoolEntry>.space + 0xa0));
        bVar5 = boost::multi_index::detail::
                hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
                ::modify_(&(this->mapTx).super_type,piVar2);
        if (!bVar5) {
          std::
          allocator_traits<std::allocator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_>_>
          ::destroy<CTxMemPoolEntry>((allocator_type *)&this->mapTx,(CTxMemPoolEntry *)piVar2);
          operator_delete(piVar2,0x178);
          psVar1 = &(this->mapTx).node_count;
          *psVar1 = *psVar1 - 1;
        }
        modifySize = modifySize + (int)iVar11;
        local_d0 = local_d0 + 1;
        if (((ulong)(this->m_opts).limits.ancestor_count <
             *(ulong *)((long)&(piVar2->
                               super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                               ).
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                               .
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                               .
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                               .
                               super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                               .super_pod_value_holder<CTxMemPoolEntry>.space + 0xe0)) ||
           ((this->m_opts).limits.ancestor_size_vbytes <
            *(long *)((long)&(piVar2->
                             super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                             ).
                             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                             .
                             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                             .
                             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                             .
                             super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                             .super_pod_value_holder<CTxMemPoolEntry>.space + 0xe8))) {
          std::
          _Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
          ::_M_insert_unique<uint256_const&>
                    ((_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
                      *)descendants_to_remove,
                     (uint256 *)
                     (*(long *)&(piVar2->
                                super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                ).
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                .
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                .
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                .
                                super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                .super_pod_value_holder<CTxMemPoolEntry>.space + 0x39));
        }
      }
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var13);
    } while ((_Rb_tree_header *)p_Var13 != &local_98._M_impl.super__Rb_tree_header);
  }
  kVar4.node = local_a0.node;
  CTxMemPoolEntry::UpdateDescendantState
            ((CTxMemPoolEntry *)local_a0.node,modifySize,modifyFee,local_d0);
  bVar5 = boost::multi_index::detail::
          hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
          ::modify_(&(this->mapTx).super_type,kVar4.node);
  if (!bVar5) {
    std::
    allocator_traits<std::allocator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_>_>
    ::destroy<CTxMemPoolEntry>((allocator_type *)&this->mapTx,(CTxMemPoolEntry *)kVar4.node);
    operator_delete(kVar4.node,0x178);
    psVar1 = &(this->mapTx).node_count;
    *psVar1 = *psVar1 - 1;
  }
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(&local_98);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CTxMemPool::UpdateForDescendants(txiter updateIt, cacheMap& cachedDescendants,
                                      const std::set<uint256>& setExclude, std::set<uint256>& descendants_to_remove)
{
    CTxMemPoolEntry::Children stageEntries, descendants;
    stageEntries = updateIt->GetMemPoolChildrenConst();

    while (!stageEntries.empty()) {
        const CTxMemPoolEntry& descendant = *stageEntries.begin();
        descendants.insert(descendant);
        stageEntries.erase(descendant);
        const CTxMemPoolEntry::Children& children = descendant.GetMemPoolChildrenConst();
        for (const CTxMemPoolEntry& childEntry : children) {
            cacheMap::iterator cacheIt = cachedDescendants.find(mapTx.iterator_to(childEntry));
            if (cacheIt != cachedDescendants.end()) {
                // We've already calculated this one, just add the entries for this set
                // but don't traverse again.
                for (txiter cacheEntry : cacheIt->second) {
                    descendants.insert(*cacheEntry);
                }
            } else if (!descendants.count(childEntry)) {
                // Schedule for later processing
                stageEntries.insert(childEntry);
            }
        }
    }
    // descendants now contains all in-mempool descendants of updateIt.
    // Update and add to cached descendant map
    int32_t modifySize = 0;
    CAmount modifyFee = 0;
    int64_t modifyCount = 0;
    for (const CTxMemPoolEntry& descendant : descendants) {
        if (!setExclude.count(descendant.GetTx().GetHash())) {
            modifySize += descendant.GetTxSize();
            modifyFee += descendant.GetModifiedFee();
            modifyCount++;
            cachedDescendants[updateIt].insert(mapTx.iterator_to(descendant));
            // Update ancestor state for each descendant
            mapTx.modify(mapTx.iterator_to(descendant), [=](CTxMemPoolEntry& e) {
              e.UpdateAncestorState(updateIt->GetTxSize(), updateIt->GetModifiedFee(), 1, updateIt->GetSigOpCost());
            });
            // Don't directly remove the transaction here -- doing so would
            // invalidate iterators in cachedDescendants. Mark it for removal
            // by inserting into descendants_to_remove.
            if (descendant.GetCountWithAncestors() > uint64_t(m_opts.limits.ancestor_count) || descendant.GetSizeWithAncestors() > m_opts.limits.ancestor_size_vbytes) {
                descendants_to_remove.insert(descendant.GetTx().GetHash());
            }
        }
    }
    mapTx.modify(updateIt, [=](CTxMemPoolEntry& e) { e.UpdateDescendantState(modifySize, modifyFee, modifyCount); });
}